

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

ecs_data_t *
ecs_table_merge(ecs_world_t *world,ecs_table_t *new_table,ecs_table_t *old_table,
               ecs_data_t *new_data,ecs_data_t *old_data)

{
  int32_t old_count_00;
  int32_t new_count_00;
  int32_t iVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 *puStack_68;
  _Bool is_monitored;
  ecs_record_t *record;
  int32_t i;
  ecs_record_t **old_records;
  int32_t new_count;
  int32_t old_count;
  ecs_entity_t *old_entities;
  _Bool move_data;
  ecs_data_t *old_data_local;
  ecs_data_t *new_data_local;
  ecs_table_t *old_table_local;
  ecs_table_t *new_table_local;
  ecs_world_t *world_local;
  
  _ecs_assert(old_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"old_table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x7b0);
  if (old_table == (ecs_table_t *)0x0) {
    __assert_fail("old_table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x7b0,
                  "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                 );
  }
  if (new_table == (ecs_table_t *)0x0) {
    ecs_table_clear_data(world,old_table,old_data);
    world_local = (ecs_world_t *)0x0;
  }
  else if (old_data == (ecs_data_t *)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    old_data_local = new_data;
    if (new_data == (ecs_data_t *)0x0) {
      old_data_local = ecs_table_get_or_create_data(new_table);
    }
    pvVar2 = _ecs_vector_first(old_data->entities,8,0x10);
    old_count_00 = ecs_vector_count(old_data->entities);
    new_count_00 = ecs_vector_count(old_data_local->entities);
    pvVar3 = _ecs_vector_first(old_data->record_ptrs,8,0x10);
    for (record._4_4_ = 0; record._4_4_ < old_count_00; record._4_4_ = record._4_4_ + 1) {
      if (new_table == old_table) {
        puStack_68 = (undefined8 *)
                     _ecs_sparse_get_or_create
                               ((world->store).entity_index,0x10,
                                *(uint64_t *)((long)pvVar2 + (long)record._4_4_ * 8));
      }
      else {
        puStack_68 = *(undefined8 **)((long)pvVar3 + (long)record._4_4_ * 8);
        _ecs_assert(puStack_68 != (undefined8 *)0x0,0xc,(char *)0x0,"record != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                    ,0x7d3);
        if (puStack_68 == (undefined8 *)0x0) {
          __assert_fail("record != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table.c"
                        ,0x7d3,
                        "ecs_data_t *ecs_table_merge(ecs_world_t *, ecs_table_t *, ecs_table_t *, ecs_data_t *, ecs_data_t *)"
                       );
        }
      }
      iVar1 = ecs_row_to_record(new_count_00 + record._4_4_,*(int *)(puStack_68 + 1) < 0);
      *(int32_t *)(puStack_68 + 1) = iVar1;
      *puStack_68 = new_table;
    }
    if (new_data == (ecs_data_t *)0x0 && new_table == old_table) {
      memcpy(old_data_local,old_data,0x28);
    }
    else {
      merge_table_data(world,new_table,old_table,old_count_00,new_count_00,old_data,old_data_local);
    }
    new_table->alloc_count = new_table->alloc_count + 1;
    if ((new_count_00 == 0) && (old_count_00 != 0)) {
      ecs_table_activate(world,new_table,(ecs_query_t *)0x0,true);
    }
    world_local = (ecs_world_t *)old_data_local;
  }
  return (ecs_data_t *)world_local;
}

Assistant:

ecs_data_t* ecs_table_merge(
    ecs_world_t * world,
    ecs_table_t *new_table,
    ecs_table_t *old_table,
    ecs_data_t *new_data,
    ecs_data_t *old_data)
{
    ecs_assert(old_table != NULL, ECS_INTERNAL_ERROR, NULL);
    bool move_data = false;
    
    /* If there is nothing to merge to, just clear the old table */
    if (!new_table) {
        ecs_table_clear_data(world, old_table, old_data);
        return NULL;
    }

    /* If there is no data to merge, drop out */
    if (!old_data) {
        return NULL;
    }

    if (!new_data) {
        new_data = ecs_table_get_or_create_data(new_table);
        if (new_table == old_table) {
            move_data = true;
        }
    }

    ecs_entity_t *old_entities = ecs_vector_first(old_data->entities, ecs_entity_t);

    int32_t old_count = ecs_vector_count(old_data->entities);
    int32_t new_count = ecs_vector_count(new_data->entities);

    ecs_record_t **old_records = ecs_vector_first(
        old_data->record_ptrs, ecs_record_t*);

    /* First, update entity index so old entities point to new type */
    int32_t i;
    for(i = 0; i < old_count; i ++) {
        ecs_record_t *record;
        if (new_table != old_table) {
            record = old_records[i];
            ecs_assert(record != NULL, ECS_INTERNAL_ERROR, NULL);
        } else {
            record = ecs_eis_get_or_create(world, old_entities[i]);
        }

        bool is_monitored = record->row < 0;
        record->row = ecs_row_to_record(new_count + i, is_monitored);
        record->table = new_table;
    }

    /* Merge table columns */
    if (move_data) {
        *new_data = *old_data;
    } else {
        merge_table_data(world, new_table, old_table, old_count, new_count, 
            old_data, new_data);
    }

    new_table->alloc_count ++;

    if (!new_count && old_count) {
        ecs_table_activate(world, new_table, NULL, true);
    }

    return new_data;
}